

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

double cpplog::log(double __x)

{
  bool bVar1;
  long *plVar2;
  long lVar3;
  undefined1 in_DIL;
  double dVar4;
  double extraout_XMM0_Qa;
  Local *local;
  undefined7 in_stack_fffffffffffffff8;
  
  plVar2 = (long *)internal::local();
  bVar1 = internal::Local::willBeLogged
                    ((Local *)CONCAT17(in_DIL,in_stack_fffffffffffffff8),
                     (Level)((ulong)plVar2 >> 0x38));
  if (bVar1) {
    lVar3 = std::chrono::_V2::system_clock::now();
    plVar2[0x31] = lVar3;
    *(undefined1 *)(plVar2 + 0x32) = in_DIL;
    dVar4 = extraout_XMM0_Qa;
  }
  else {
    dVar4 = (double)std::wios::setstate((int)plVar2 + (int)*(undefined8 *)(*plVar2 + -0x18));
  }
  return dVar4;
}

Assistant:

std::wostream& cpplog::log(Level level)
{
    auto& local = cpplog::internal::local;
    if(!(local.willBeLogged(level)))
    {
        // apparently setting the bad-bit will prevent the << operators from running conversion, which saves some
        // processing power
        // https://stackoverflow.com/questions/8243743/is-there-a-null-stdostream-implementation-in-c-or-libraries
        local.stream.setstate(std::ios::badbit);
    }
    else
    {
        local.start = std::chrono::system_clock::now();
        local.level = level;
    }
    return local.stream;
}